

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O2

int SUNLogger_CreateFromEnv(void *comm,SUNLogger *logger)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *warning_filename;
  char *info_filename;
  char *debug_filename;
  
  pcVar6 = getenv("SUNLOGGER_OUTPUT_RANK");
  if (pcVar6 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = atoi(pcVar6);
  }
  pcVar6 = getenv("SUNLOGGER_ERROR_FILENAME");
  warning_filename = getenv("SUNLOGGER_WARNING_FILENAME");
  info_filename = getenv("SUNLOGGER_INFO_FILENAME");
  debug_filename = getenv("SUNLOGGER_DEBUG_FILENAME");
  iVar1 = SUNLogger_Create(comm,iVar1,logger);
  iVar2 = SUNLogger_SetErrorFilename(*logger,pcVar6);
  iVar3 = SUNLogger_SetWarningFilename(*logger,warning_filename);
  iVar4 = SUNLogger_SetDebugFilename(*logger,debug_filename);
  iVar5 = SUNLogger_SetInfoFilename(*logger,info_filename);
  return iVar5 + iVar4 + iVar3 + iVar2 + iVar1 >> 0x1f;
}

Assistant:

int SUNLogger_CreateFromEnv(void* comm, SUNLogger* logger)
{
  int retval = 0;

  const char* output_rank_env   = getenv("SUNLOGGER_OUTPUT_RANK");
  int output_rank               = (output_rank_env) ? atoi(output_rank_env) : 0;
  const char* error_fname_env   = getenv("SUNLOGGER_ERROR_FILENAME");
  const char* warning_fname_env = getenv("SUNLOGGER_WARNING_FILENAME");
  const char* info_fname_env    = getenv("SUNLOGGER_INFO_FILENAME");
  const char* debug_fname_env   = getenv("SUNLOGGER_DEBUG_FILENAME");

  retval += SUNLogger_Create(comm, output_rank, logger);
  retval += SUNLogger_SetErrorFilename(*logger, error_fname_env);
  retval += SUNLogger_SetWarningFilename(*logger, warning_fname_env);
  retval += SUNLogger_SetDebugFilename(*logger, debug_fname_env);
  retval += SUNLogger_SetInfoFilename(*logger, info_fname_env);

  return (retval < 0) ? -1 : 0;
}